

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

int __thiscall
raspicam::_private::Private_Impl::convertFormat(Private_Impl *this,RASPICAM_FORMAT fmt)

{
  RASPICAM_FORMAT fmt_local;
  Private_Impl *this_local;
  int local_4;
  
  switch(fmt) {
  case RASPICAM_FORMAT_YUV420:
    local_4 = 0x30323449;
    break;
  case RASPICAM_FORMAT_GRAY:
    local_4 = 0x30323449;
    break;
  case RASPICAM_FORMAT_BGR:
    local_4 = 0x33524742;
    break;
  case RASPICAM_FORMAT_RGB:
    local_4 = 0x33424752;
    break;
  default:
    local_4 = 0x30323449;
  }
  return local_4;
}

Assistant:

int Private_Impl::convertFormat ( RASPICAM_FORMAT fmt ) {
            switch ( fmt ) {
            case RASPICAM_FORMAT_RGB:
                return MMAL_ENCODING_RGB24;
            case RASPICAM_FORMAT_BGR:
                return MMAL_ENCODING_BGR24;
            case RASPICAM_FORMAT_GRAY:
                return MMAL_ENCODING_I420;
            case RASPICAM_FORMAT_YUV420:
                return MMAL_ENCODING_I420;
            default:
                return MMAL_ENCODING_I420;
            }
        }